

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionGraph.cpp
# Opt level: O2

void DumpGraph(ScopeData *scope)

{
  ExpressionGraphContext exprGraphCtx;
  OutputContext local_acb8;
  char tempBuf [4096];
  char outputBuf [4096];
  ExpressionContext exprCtx;
  
  ExpressionContext::ExpressionContext(&exprCtx,(Allocator *)0x0,0);
  local_acb8.stream = (void *)0x0;
  local_acb8.openStream = OutputContext::FileOpen;
  local_acb8.writeStream = OutputContext::FileWrite;
  local_acb8.closeStream = OutputContext::FileClose;
  local_acb8.outputBufSize = 0x1000;
  local_acb8.outputBufPos = 0;
  local_acb8.outputBuf = outputBuf;
  local_acb8.tempBuf = tempBuf;
  local_acb8.tempBufSize = 0x1000;
  local_acb8.stream = OutputContext::FileOpen("expr_graph.txt");
  exprGraphCtx.output = &local_acb8;
  exprGraphCtx.depth = 0;
  local_acb8.writeStream = OutputContext::FileWrite;
  exprGraphCtx.skipImported = false;
  exprGraphCtx.skipFunctionDefinitions = false;
  exprGraphCtx.ctx = &exprCtx;
  PrintGraph(&exprGraphCtx,scope,true);
  PrintGraph(&exprGraphCtx,scope,false);
  fclose((FILE *)local_acb8.stream);
  local_acb8.stream = (void *)0x0;
  OutputContext::~OutputContext(&local_acb8);
  ExpressionContext::~ExpressionContext(&exprCtx);
  return;
}

Assistant:

void DumpGraph(ScopeData *scope)
{
	ExpressionContext exprCtx(0, 0);
	OutputContext outputCtx;

	char outputBuf[4096];
	outputCtx.outputBuf = outputBuf;
	outputCtx.outputBufSize = 4096;

	char tempBuf[4096];
	outputCtx.tempBuf = tempBuf;
	outputCtx.tempBufSize = 4096;

	outputCtx.stream = OutputContext::FileOpen("expr_graph.txt");
	outputCtx.writeStream = OutputContext::FileWrite;

	ExpressionGraphContext exprGraphCtx(exprCtx, outputCtx);

	PrintGraph(exprGraphCtx, scope, true);

	PrintGraph(exprGraphCtx, scope, false);

	OutputContext::FileClose(outputCtx.stream);
	outputCtx.stream = NULL;
}